

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  RTCRayQueryContext *pRVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*pauVar16) [16];
  byte bVar17;
  int iVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong unaff_R12;
  size_t mask;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  undefined1 auVar60 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_117c;
  int local_115c;
  RTCIntersectArguments *local_1158;
  ulong local_1150;
  Geometry *local_1148;
  long local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  undefined1 (*local_1120) [16];
  RayQueryContext *local_1118;
  Scene *local_1110;
  RTCFilterFunctionNArguments local_1108;
  float local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  float local_10cc;
  float local_10c8;
  undefined4 local_10c4;
  uint local_10c0;
  uint local_10bc;
  uint local_10b8;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  byte local_1067;
  float local_1058 [4];
  float local_1048 [4];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1120 = (undefined1 (*) [16])local_f68;
      aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl((undefined1  [16])aVar1,auVar27);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar21 = vcmpps_avx512vl(auVar27,auVar45,1);
      bVar3 = (bool)((byte)uVar21 & 1);
      auVar29._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.x;
      bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.y;
      bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar1.z;
      bVar3 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar1.field_3.a;
      auVar27 = vrcp14ps_avx512vl(auVar29);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = &DAT_3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28 = vfnmadd213ps_avx512vl(auVar29,auVar27,auVar28);
      auVar47 = vfmadd132ps_fma(auVar28,auVar27,auVar27);
      auVar27 = vbroadcastss_avx512vl(auVar47);
      auVar75 = ZEXT1664(auVar27);
      auVar27 = vmovshdup_avx(auVar47);
      auVar28 = vshufps_avx512vl(auVar47,auVar47,0x55);
      auVar76 = ZEXT1664(auVar28);
      auVar28 = vshufpd_avx(auVar47,auVar47,1);
      auVar29 = vshufps_avx512vl(auVar47,auVar47,0xaa);
      auVar77 = ZEXT1664(auVar29);
      auVar51._0_4_ = auVar47._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar51._4_4_ = auVar47._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar51._8_4_ = auVar47._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar51._12_4_ = auVar47._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar46._4_4_ = auVar51._0_4_;
      auVar46._0_4_ = auVar51._0_4_;
      auVar46._8_4_ = auVar51._0_4_;
      auVar46._12_4_ = auVar51._0_4_;
      auVar29 = vshufps_avx(auVar51,auVar51,0x55);
      auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
      local_1128 = (ulong)(auVar47._0_4_ < 0.0) << 4;
      local_1130 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      local_1138 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x40;
      uVar24 = local_1128 ^ 0x10;
      uVar21 = local_1130 ^ 0x10;
      uVar26 = local_1138 ^ 0x10;
      auVar30 = vbroadcastss_avx512vl(auVar30);
      auVar78 = ZEXT1664(auVar30);
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      uVar58 = auVar31._0_4_;
      auVar55 = ZEXT1664(CONCAT412(uVar58,CONCAT48(uVar58,CONCAT44(uVar58,uVar58))));
      auVar30 = vxorps_avx512vl(auVar46,auVar47);
      auVar79 = ZEXT1664(auVar30);
      auVar30 = vxorps_avx512vl(auVar29,auVar47);
      auVar80 = ZEXT1664(auVar30);
      auVar30 = vxorps_avx512vl(auVar51,auVar47);
      auVar81 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = ZEXT1664(auVar30);
      auVar30 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar83 = ZEXT1664(auVar30);
      auVar30 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar84 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar85 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar86 = ZEXT1664(auVar30);
      local_1118 = context;
      do {
        do {
          do {
            if (local_1120 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar16 = local_1120 + -1;
            local_1120 = local_1120 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar16 + 8));
          uVar20 = *(ulong *)*local_1120;
          do {
            if ((uVar20 & 8) == 0) {
              uVar19 = uVar20 & 0xfffffffffffffff0;
              uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar44._4_4_ = uVar58;
              auVar44._0_4_ = uVar58;
              auVar44._8_4_ = uVar58;
              auVar44._12_4_ = uVar58;
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + local_1128),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + local_1128));
              auVar31 = vfmadd213ps_avx512vl(auVar30,auVar75._0_16_,auVar79._0_16_);
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + local_1130),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + local_1130));
              auVar27 = vmaxps_avx512vl(auVar78._0_16_,auVar31);
              auVar31 = vfmadd213ps_avx512vl(auVar30,auVar76._0_16_,auVar80._0_16_);
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + local_1138),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + local_1138));
              auVar30 = vfmadd213ps_avx512vl(auVar30,auVar77._0_16_,auVar81._0_16_);
              auVar30 = vmaxps_avx(auVar31,auVar30);
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar24),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + uVar24));
              local_10a8 = vmaxps_avx(auVar27,auVar30);
              auVar31 = vfmadd213ps_avx512vl(auVar31,auVar75._0_16_,auVar79._0_16_);
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar21),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + uVar21));
              auVar27 = vfmadd213ps_avx512vl(auVar30,auVar76._0_16_,auVar80._0_16_);
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar26),auVar44,
                                        *(undefined1 (*) [16])(uVar19 + 0x20 + uVar26));
              auVar30 = vfmadd213ps_avx512vl(auVar30,auVar77._0_16_,auVar81._0_16_);
              auVar30 = vminps_avx(auVar27,auVar30);
              auVar31 = vminps_avx(auVar55._0_16_,auVar31);
              auVar30 = vminps_avx(auVar31,auVar30);
              uVar5 = vcmpps_avx512vl(local_10a8,auVar30,2);
              bVar17 = (byte)uVar5;
              if (((uint)uVar20 & 7) == 6) {
                uVar5 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
                uVar6 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar19 + 0xe0),0xd);
                bVar17 = (byte)uVar5 & (byte)uVar6 & bVar17;
              }
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar17);
            }
            if ((uVar20 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar18 = 4;
              }
              else {
                uVar19 = uVar20 & 0xfffffffffffffff0;
                lVar25 = 0;
                for (uVar20 = unaff_R12; (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  lVar25 = lVar25 + 1;
                }
                iVar18 = 0;
                uVar23 = unaff_R12 - 1 & unaff_R12;
                uVar20 = *(ulong *)(uVar19 + lVar25 * 8);
                if (uVar23 != 0) {
                  uVar66 = *(uint *)(local_10a8 + lVar25 * 4);
                  lVar25 = 0;
                  for (uVar9 = uVar23; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                    lVar25 = lVar25 + 1;
                  }
                  uVar23 = uVar23 - 1 & uVar23;
                  uVar9 = *(ulong *)(uVar19 + lVar25 * 8);
                  uVar67 = *(uint *)(local_10a8 + lVar25 * 4);
                  if (uVar23 == 0) {
                    if (uVar66 < uVar67) {
                      *(ulong *)*local_1120 = uVar9;
                      *(uint *)((long)*local_1120 + 8) = uVar67;
                      local_1120 = local_1120 + 1;
                    }
                    else {
                      *(ulong *)*local_1120 = uVar20;
                      *(uint *)((long)*local_1120 + 8) = uVar66;
                      uVar20 = uVar9;
                      local_1120 = local_1120 + 1;
                    }
                  }
                  else {
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = uVar20;
                    auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar66));
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = uVar9;
                    auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar67));
                    lVar25 = 0;
                    for (uVar20 = uVar23; (uVar20 & 1) == 0;
                        uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    uVar23 = uVar23 - 1 & uVar23;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = *(ulong *)(uVar19 + lVar25 * 8);
                    auVar51 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_10a8 + lVar25 * 4)));
                    auVar27 = vpshufd_avx(auVar30,0xaa);
                    auVar28 = vpshufd_avx(auVar31,0xaa);
                    auVar29 = vpshufd_avx(auVar51,0xaa);
                    if (uVar23 == 0) {
                      uVar20 = vpcmpgtd_avx512vl(auVar28,auVar27);
                      uVar20 = uVar20 & 0xf;
                      auVar28 = vpblendmd_avx512vl(auVar31,auVar30);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar32._0_4_ = (uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar27._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar32._4_4_ = (uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar27._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar32._8_4_ = (uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar27._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar32._12_4_ = (uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar27._12_4_;
                      auVar31 = vmovdqa32_avx512vl(auVar31);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar33._0_4_ = (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar33._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar33._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar33._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                      auVar30 = vpshufd_avx(auVar32,0xaa);
                      uVar19 = vpcmpgtd_avx512vl(auVar29,auVar30);
                      uVar19 = uVar19 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar51,auVar32);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      bVar4 = (bool)((byte)(uVar19 >> 1) & 1);
                      uVar20 = CONCAT44((uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar30._4_4_,
                                        (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_);
                      auVar30 = vmovdqa32_avx512vl(auVar51);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar34._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * auVar32._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar34._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * auVar32._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar34._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * auVar32._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar34._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * auVar32._12_4_;
                      auVar30 = vpshufd_avx(auVar34,0xaa);
                      auVar31 = vpshufd_avx(auVar33,0xaa);
                      uVar19 = vpcmpgtd_avx512vl(auVar30,auVar31);
                      uVar19 = uVar19 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar34,auVar33);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar35._0_4_ = (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar35._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar35._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar35._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                      auVar30 = vmovdqa32_avx512vl(auVar34);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar36._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * auVar33._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar36._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * auVar33._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar36._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * auVar33._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar36._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * auVar33._12_4_;
                      *local_1120 = auVar36;
                      local_1120[1] = auVar35;
                      local_1120 = local_1120 + 2;
                    }
                    else {
                      lVar25 = 0;
                      for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      uVar66 = *(uint *)(local_10a8 + lVar25 * 4);
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = *(ulong *)(uVar19 + lVar25 * 8);
                      auVar47 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar66));
                      uVar20 = vpcmpgtd_avx512vl(auVar28,auVar27);
                      uVar20 = uVar20 & 0xf;
                      auVar28 = vpblendmd_avx512vl(auVar31,auVar30);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar49._0_4_ = (uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar27._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar27._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar27._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar49._12_4_ = (uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar27._12_4_;
                      auVar31 = vmovdqa32_avx512vl(auVar31);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar50._0_4_ = (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar50._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar50._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar50._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                      auVar60._4_4_ = uVar66;
                      auVar60._0_4_ = uVar66;
                      auVar60._8_4_ = uVar66;
                      auVar60._12_4_ = uVar66;
                      uVar20 = vpcmpgtd_avx512vl(auVar60,auVar29);
                      uVar20 = uVar20 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar47,auVar51);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar37._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * uVar66;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar37._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * uVar66;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar37._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * uVar66;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar37._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * uVar66;
                      auVar30 = vmovdqa32_avx512vl(auVar47);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar38._0_4_ = (uint)bVar3 * auVar30._0_4_ | (uint)!bVar3 * auVar51._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar38._4_4_ = (uint)bVar3 * auVar30._4_4_ | (uint)!bVar3 * auVar51._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar38._8_4_ = (uint)bVar3 * auVar30._8_4_ | (uint)!bVar3 * auVar51._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar38._12_4_ = (uint)bVar3 * auVar30._12_4_ | (uint)!bVar3 * auVar51._12_4_;
                      auVar30 = vpshufd_avx(auVar38,0xaa);
                      auVar31 = vpshufd_avx(auVar50,0xaa);
                      uVar20 = vpcmpgtd_avx512vl(auVar30,auVar31);
                      uVar20 = uVar20 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar38,auVar50);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar39._0_4_ = (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar39._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar39._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar39._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                      auVar30 = vmovdqa32_avx512vl(auVar38);
                      bVar3 = (bool)((byte)uVar20 & 1);
                      auVar40._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * auVar50._0_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar40._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * auVar50._4_4_;
                      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar40._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * auVar50._8_4_;
                      bVar3 = SUB81(uVar20 >> 3,0);
                      auVar40._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * auVar50._12_4_;
                      auVar30 = vpshufd_avx(auVar37,0xaa);
                      auVar31 = vpshufd_avx(auVar49,0xaa);
                      uVar19 = vpcmpgtd_avx512vl(auVar30,auVar31);
                      uVar19 = uVar19 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar37,auVar49);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      bVar4 = (bool)((byte)(uVar19 >> 1) & 1);
                      uVar20 = CONCAT44((uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar30._4_4_,
                                        (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_);
                      auVar30 = vmovdqa32_avx512vl(auVar37);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar41._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * auVar49._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar41._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * auVar49._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar41._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * auVar49._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar41._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * auVar49._12_4_;
                      auVar30 = vpshufd_avx(auVar41,0xaa);
                      auVar31 = vpshufd_avx(auVar39,0xaa);
                      uVar19 = vpcmpgtd_avx512vl(auVar31,auVar30);
                      uVar19 = uVar19 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar39,auVar41);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar42._0_4_ = (uint)bVar3 * auVar31._0_4_ | (uint)!bVar3 * auVar30._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar42._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar42._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar42._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                      auVar30 = vmovdqa32_avx512vl(auVar39);
                      bVar3 = (bool)((byte)uVar19 & 1);
                      auVar43._0_4_ = (uint)bVar3 * auVar30._0_4_ | !bVar3 * auVar41._0_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
                      auVar43._4_4_ = (uint)bVar3 * auVar30._4_4_ | !bVar3 * auVar41._4_4_;
                      bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
                      auVar43._8_4_ = (uint)bVar3 * auVar30._8_4_ | !bVar3 * auVar41._8_4_;
                      bVar3 = SUB81(uVar19 >> 3,0);
                      auVar43._12_4_ = (uint)bVar3 * auVar30._12_4_ | !bVar3 * auVar41._12_4_;
                      *local_1120 = auVar40;
                      local_1120[1] = auVar43;
                      local_1120[2] = auVar42;
                      local_1120 = local_1120 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        local_1140 = (ulong)((uint)uVar20 & 0xf) - 8;
        if (local_1140 != 0) {
          uVar20 = uVar20 & 0xfffffffffffffff0;
          lVar25 = 0;
          do {
            lVar22 = lVar25 * 0x140;
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar53._4_4_ = uVar58;
            auVar53._0_4_ = uVar58;
            auVar53._8_4_ = uVar58;
            auVar53._12_4_ = uVar58;
            auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x90 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + lVar22));
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xa0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x10 + lVar22));
            auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xb0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x20 + lVar22));
            auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xc0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x30 + lVar22));
            auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xd0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x40 + lVar22));
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xe0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x50 + lVar22));
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xf0 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x60 + lVar22));
            auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x100 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x70 + lVar22));
            auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x110 + lVar22),auVar53,
                                      *(undefined1 (*) [16])(uVar20 + 0x80 + lVar22));
            auVar30 = vsubps_avx(auVar47,auVar30);
            auVar31 = vsubps_avx(auVar45,auVar31);
            auVar27 = vsubps_avx(auVar46,auVar27);
            auVar28 = vsubps_avx(auVar28,auVar47);
            auVar29 = vsubps_avx(auVar29,auVar45);
            auVar51 = vsubps_avx(auVar51,auVar46);
            auVar54._0_4_ = auVar31._0_4_ * auVar51._0_4_;
            auVar54._4_4_ = auVar31._4_4_ * auVar51._4_4_;
            auVar54._8_4_ = auVar31._8_4_ * auVar51._8_4_;
            auVar54._12_4_ = auVar31._12_4_ * auVar51._12_4_;
            local_1028 = vfmsub231ps_fma(auVar54,auVar29,auVar27);
            auVar56._0_4_ = auVar27._0_4_ * auVar28._0_4_;
            auVar56._4_4_ = auVar27._4_4_ * auVar28._4_4_;
            auVar56._8_4_ = auVar27._8_4_ * auVar28._8_4_;
            auVar56._12_4_ = auVar27._12_4_ * auVar28._12_4_;
            local_1018 = vfmsub231ps_fma(auVar56,auVar51,auVar30);
            auVar57._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar57._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar57._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar57._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar71._4_4_ = uVar58;
            auVar71._0_4_ = uVar58;
            auVar71._8_4_ = uVar58;
            auVar71._12_4_ = uVar58;
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar72._4_4_ = uVar58;
            auVar72._0_4_ = uVar58;
            auVar72._8_4_ = uVar58;
            auVar72._12_4_ = uVar58;
            fVar59 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar73._4_4_ = fVar59;
            auVar73._0_4_ = fVar59;
            auVar73._8_4_ = fVar59;
            auVar73._12_4_ = fVar59;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar10._4_4_ = uVar58;
            auVar10._0_4_ = uVar58;
            auVar10._8_4_ = uVar58;
            auVar10._12_4_ = uVar58;
            auVar44 = vsubps_avx512vl(auVar47,auVar10);
            local_1008 = vfmsub231ps_fma(auVar57,auVar28,auVar31);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar11._4_4_ = uVar58;
            auVar11._0_4_ = uVar58;
            auVar11._8_4_ = uVar58;
            auVar11._12_4_ = uVar58;
            auVar45 = vsubps_avx512vl(auVar45,auVar11);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar12._4_4_ = uVar58;
            auVar12._0_4_ = uVar58;
            auVar12._8_4_ = uVar58;
            auVar12._12_4_ = uVar58;
            auVar46 = vsubps_avx512vl(auVar46,auVar12);
            auVar47 = vmulps_avx512vl(auVar72,auVar46);
            auVar48 = vfmsub231ps_avx512vl(auVar47,auVar45,auVar73);
            auVar47 = vmulps_avx512vl(auVar73,auVar44);
            auVar49 = vfmsub231ps_avx512vl(auVar47,auVar46,auVar71);
            auVar47 = vmulps_avx512vl(auVar71,auVar45);
            auVar50 = vfmsub231ps_avx512vl(auVar47,auVar44,auVar72);
            auVar74._0_4_ = fVar59 * local_1008._0_4_;
            auVar74._4_4_ = fVar59 * local_1008._4_4_;
            auVar74._8_4_ = fVar59 * local_1008._8_4_;
            auVar74._12_4_ = fVar59 * local_1008._12_4_;
            auVar47 = vfmadd231ps_fma(auVar74,local_1018,auVar72);
            auVar47 = vfmadd231ps_fma(auVar47,local_1028,auVar71);
            local_1078 = vandps_avx512vl(auVar47,auVar82._0_16_);
            auVar51 = vmulps_avx512vl(auVar51,auVar50);
            auVar29 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar29);
            auVar28 = vfmadd231ps_avx512vl(auVar29,auVar48,auVar28);
            auVar29 = vandps_avx512vl(auVar47,auVar83._0_16_);
            uVar66 = auVar29._0_4_;
            local_10a8._0_4_ = (float)(uVar66 ^ auVar28._0_4_);
            uVar67 = auVar29._4_4_;
            local_10a8._4_4_ = (float)(uVar67 ^ auVar28._4_4_);
            uVar68 = auVar29._8_4_;
            local_10a8._8_4_ = (float)(uVar68 ^ auVar28._8_4_);
            uVar69 = auVar29._12_4_;
            local_10a8._12_4_ = (float)(uVar69 ^ auVar28._12_4_);
            auVar27 = vmulps_avx512vl(auVar27,auVar50);
            auVar31 = vfmadd231ps_avx512vl(auVar27,auVar31,auVar49);
            auVar30 = vfmadd231ps_avx512vl(auVar31,auVar30,auVar48);
            local_1098._0_4_ = (float)(uVar66 ^ auVar30._0_4_);
            local_1098._4_4_ = (float)(uVar67 ^ auVar30._4_4_);
            local_1098._8_4_ = (float)(uVar68 ^ auVar30._8_4_);
            local_1098._12_4_ = (float)(uVar69 ^ auVar30._12_4_);
            auVar30 = auVar84._0_16_;
            uVar5 = vcmpps_avx512vl(local_10a8,auVar30,5);
            uVar6 = vcmpps_avx512vl(local_1098,auVar30,5);
            uVar7 = vcmpps_avx512vl(auVar47,auVar30,4);
            auVar70._0_4_ = local_1098._0_4_ + local_10a8._0_4_;
            auVar70._4_4_ = local_1098._4_4_ + local_10a8._4_4_;
            auVar70._8_4_ = local_1098._8_4_ + local_10a8._8_4_;
            auVar70._12_4_ = local_1098._12_4_ + local_10a8._12_4_;
            uVar8 = vcmpps_avx512vl(auVar70,local_1078,2);
            local_1067 = (byte)uVar5 & (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
            if (local_1067 != 0) {
              auVar64._0_4_ = local_1008._0_4_ * auVar46._0_4_;
              auVar64._4_4_ = local_1008._4_4_ * auVar46._4_4_;
              auVar64._8_4_ = local_1008._8_4_ * auVar46._8_4_;
              auVar64._12_4_ = local_1008._12_4_ * auVar46._12_4_;
              auVar30 = vfmadd213ps_fma(auVar45,local_1018,auVar64);
              auVar30 = vfmadd213ps_fma(auVar44,local_1028,auVar30);
              local_1088._0_4_ = (float)(uVar66 ^ auVar30._0_4_);
              local_1088._4_4_ = (float)(uVar67 ^ auVar30._4_4_);
              local_1088._8_4_ = (float)(uVar68 ^ auVar30._8_4_);
              local_1088._12_4_ = (float)(uVar69 ^ auVar30._12_4_);
              uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar13._4_4_ = uVar58;
              auVar13._0_4_ = uVar58;
              auVar13._8_4_ = uVar58;
              auVar13._12_4_ = uVar58;
              auVar30 = vmulps_avx512vl(local_1078,auVar13);
              fVar59 = (ray->super_RayK<1>).tfar;
              auVar14._4_4_ = fVar59;
              auVar14._0_4_ = fVar59;
              auVar14._8_4_ = fVar59;
              auVar14._12_4_ = fVar59;
              auVar31 = vmulps_avx512vl(local_1078,auVar14);
              uVar5 = vcmpps_avx512vl(local_1088,auVar31,2);
              uVar6 = vcmpps_avx512vl(auVar30,local_1088,1);
              local_1067 = (byte)uVar5 & (byte)uVar6 & local_1067;
              if (local_1067 != 0) {
                lVar22 = lVar22 + uVar20;
                auVar30 = vrcp14ps_avx512vl(local_1078);
                auVar31 = vfnmadd213ps_avx512vl(local_1078,auVar30,auVar85._0_16_);
                auVar30 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
                fVar59 = auVar30._0_4_;
                local_1038._0_4_ = fVar59 * local_1088._0_4_;
                fVar61 = auVar30._4_4_;
                local_1038._4_4_ = fVar61 * local_1088._4_4_;
                fVar62 = auVar30._8_4_;
                local_1038._8_4_ = fVar62 * local_1088._8_4_;
                fVar63 = auVar30._12_4_;
                local_1038._12_4_ = fVar63 * local_1088._12_4_;
                auVar55 = ZEXT1664(local_1038);
                local_1058[0] = fVar59 * local_10a8._0_4_;
                local_1058[1] = fVar61 * local_10a8._4_4_;
                local_1058[2] = fVar62 * local_10a8._8_4_;
                local_1058[3] = fVar63 * local_10a8._12_4_;
                local_1048[0] = fVar59 * local_1098._0_4_;
                local_1048[1] = fVar61 * local_1098._4_4_;
                local_1048[2] = fVar62 * local_1098._8_4_;
                local_1048[3] = fVar63 * local_1098._12_4_;
                local_1110 = local_1118->scene;
                auVar30 = vblendmps_avx512vl(auVar86._0_16_,local_1038);
                auVar52._0_4_ =
                     (uint)(local_1067 & 1) * auVar30._0_4_ |
                     (uint)!(bool)(local_1067 & 1) * (int)(fVar59 * local_1098._0_4_);
                bVar3 = (bool)(local_1067 >> 1 & 1);
                auVar52._4_4_ =
                     (uint)bVar3 * auVar30._4_4_ | (uint)!bVar3 * (int)(fVar61 * local_1098._4_4_);
                bVar3 = (bool)(local_1067 >> 2 & 1);
                auVar52._8_4_ =
                     (uint)bVar3 * auVar30._8_4_ | (uint)!bVar3 * (int)(fVar62 * local_1098._8_4_);
                bVar3 = (bool)(local_1067 >> 3 & 1);
                auVar52._12_4_ =
                     (uint)bVar3 * auVar30._12_4_ | (uint)!bVar3 * (int)(fVar63 * local_1098._12_4_)
                ;
                auVar30 = vshufps_avx(auVar52,auVar52,0xb1);
                auVar30 = vminps_avx(auVar30,auVar52);
                auVar31 = vshufpd_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar31,auVar30);
                uVar5 = vcmpps_avx512vl(auVar52,auVar30,0);
                local_117c = (uint)local_1067;
                uVar66 = (uint)((byte)uVar5 & local_1067);
                if (((byte)uVar5 & local_1067) == 0) {
                  uVar66 = local_117c;
                }
                uVar19 = 0;
                for (uVar23 = (ulong)uVar66; (uVar23 & 1) == 0;
                    uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                  uVar19 = uVar19 + 1;
                }
                do {
                  auVar31 = auVar84._0_16_;
                  local_10c0 = *(uint *)(lVar22 + 0x120 + uVar19 * 4);
                  local_1150 = (ulong)local_10c0;
                  local_1148 = (local_1110->geometries).items[local_10c0].ptr;
                  auVar30 = auVar52;
                  if ((local_1148->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_117c = (uint)(~(byte)(1 << ((uint)uVar19 & 0x1f)) & (byte)local_117c);
                    bVar3 = true;
                  }
                  else if ((local_1118->args->filter == (RTCFilterFunctionN)0x0) &&
                          (local_1148->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar3 = false;
                  }
                  else {
                    local_1158 = local_1118->args;
                    local_ff8 = auVar55._0_16_;
                    local_fe8 = auVar81._0_16_;
                    local_fd8 = auVar80._0_16_;
                    local_fc8 = auVar79._0_16_;
                    local_fb8 = auVar78._0_16_;
                    local_fa8 = auVar77._0_16_;
                    local_f98 = auVar76._0_16_;
                    local_f88 = auVar75._0_16_;
                    local_1108.context = local_1118->user;
                    local_10d8 = *(float *)(local_1028 + uVar19 * 4);
                    local_10d4 = *(undefined4 *)(local_1018 + uVar19 * 4);
                    local_10d0 = *(undefined4 *)(local_1008 + uVar19 * 4);
                    local_10cc = local_1058[uVar19];
                    local_10c8 = local_1048[uVar19];
                    local_10c4 = *(undefined4 *)(lVar22 + 0x130 + uVar19 * 4);
                    local_10bc = (local_1108.context)->instID[0];
                    local_10b8 = (local_1108.context)->instPrimID[0];
                    fVar59 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar19 * 4);
                    local_115c = -1;
                    local_1108.valid = &local_115c;
                    local_1108.geometryUserPtr = local_1148->userPtr;
                    local_1108.ray = (RTCRayN *)ray;
                    local_1108.hit = (RTCHitN *)&local_10d8;
                    local_1108.N = 1;
                    if ((local_1148->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_1148->intersectionFilterN)(&local_1108), *local_1108.valid != 0)) {
                      if (local_1158->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1158->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_1148->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1158->filter)(&local_1108);
                        }
                        if (*local_1108.valid == 0) goto LAB_01f46907;
                      }
                      (((Vec3f *)((long)local_1108.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1108.hit;
                      (((Vec3f *)((long)local_1108.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1108.hit + 4);
                      (((Vec3f *)((long)local_1108.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1108.hit + 8);
                      *(float *)((long)local_1108.ray + 0x3c) = *(float *)(local_1108.hit + 0xc);
                      fVar59 = *(float *)(local_1108.hit + 0x10);
                      *(float *)((long)local_1108.ray + 0x40) = fVar59;
                      *(float *)((long)local_1108.ray + 0x44) = *(float *)(local_1108.hit + 0x14);
                      *(float *)((long)local_1108.ray + 0x48) = *(float *)(local_1108.hit + 0x18);
                      *(float *)((long)local_1108.ray + 0x4c) = *(float *)(local_1108.hit + 0x1c);
                      *(float *)((long)local_1108.ray + 0x50) = *(float *)(local_1108.hit + 0x20);
                    }
                    else {
LAB_01f46907:
                      (ray->super_RayK<1>).tfar = fVar59;
                    }
                    auVar55 = ZEXT1664(local_ff8);
                    fVar61 = (ray->super_RayK<1>).tfar;
                    auVar15._4_4_ = fVar61;
                    auVar15._0_4_ = fVar61;
                    auVar15._8_4_ = fVar61;
                    auVar15._12_4_ = fVar61;
                    uVar5 = vcmpps_avx512vl(local_ff8,auVar15,2);
                    local_117c = (uint)(byte)(~(byte)(1 << ((uint)uVar19 & 0x1f)) & (byte)local_117c
                                             & (byte)uVar5);
                    bVar3 = true;
                    auVar75 = ZEXT1664(local_f88);
                    auVar76 = ZEXT1664(local_f98);
                    auVar77 = ZEXT1664(local_fa8);
                    auVar78 = ZEXT1664(local_fb8);
                    auVar79 = ZEXT1664(local_fc8);
                    auVar80 = ZEXT1664(local_fd8);
                    auVar81 = ZEXT1664(local_fe8);
                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar82 = ZEXT1664(auVar30);
                    auVar30 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                    auVar83 = ZEXT1664(auVar30);
                    auVar30 = vxorps_avx512vl(auVar31,auVar31);
                    auVar84 = ZEXT1664(auVar30);
                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar85 = ZEXT1664(auVar30);
                    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar86 = ZEXT1664(auVar30);
                    auVar30 = ZEXT416((uint)fVar59);
                  }
                  if (!bVar3) {
                    fVar59 = local_1058[uVar19];
                    fVar61 = local_1048[uVar19];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar19 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + uVar19 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + uVar19 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1008 + uVar19 * 4);
                    ray->u = fVar59;
                    ray->v = fVar61;
                    ray->primID = *(uint *)(lVar22 + 0x130 + uVar19 * 4);
                    ray->geomID = (uint)local_1150;
                    pRVar2 = local_1118->user;
                    ray->instID[0] = pRVar2->instID[0];
                    ray->instPrimID[0] = pRVar2->instPrimID[0];
                    break;
                  }
                  bVar17 = (byte)local_117c;
                  if (bVar17 == 0) break;
                  auVar31 = vblendmps_avx512vl(auVar86._0_16_,auVar55._0_16_);
                  auVar52._0_4_ =
                       (uint)(bVar17 & 1) * auVar31._0_4_ |
                       (uint)!(bool)(bVar17 & 1) * auVar30._0_4_;
                  bVar3 = (bool)((byte)(local_117c >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * auVar30._4_4_;
                  bVar3 = (bool)((byte)(local_117c >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * auVar30._8_4_;
                  bVar3 = (bool)((byte)(local_117c >> 3) & 1);
                  auVar52._12_4_ = (uint)bVar3 * auVar31._12_4_ | (uint)!bVar3 * auVar30._12_4_;
                  auVar30 = vshufps_avx(auVar52,auVar52,0xb1);
                  auVar30 = vminps_avx(auVar30,auVar52);
                  auVar31 = vshufpd_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar31,auVar30);
                  uVar5 = vcmpps_avx512vl(auVar52,auVar30,0);
                  bVar17 = (byte)uVar5 & bVar17;
                  uVar66 = local_117c;
                  if (bVar17 != 0) {
                    uVar66 = (uint)bVar17;
                  }
                  uVar67 = 0;
                  for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                    uVar67 = uVar67 + 1;
                  }
                  uVar19 = (ulong)uVar67;
                } while( true );
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != local_1140);
        }
        fVar59 = (ray->super_RayK<1>).tfar;
        auVar55 = ZEXT1664(CONCAT412(fVar59,CONCAT48(fVar59,CONCAT44(fVar59,fVar59))));
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }